

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patternprops.cpp
# Opt level: O0

UChar * icu_63::PatternProps::trimWhiteSpace(UChar *s,int32_t *length)

{
  UBool UVar1;
  bool bVar2;
  int local_28;
  int local_24;
  int32_t limit;
  int32_t start;
  int32_t *length_local;
  UChar *s_local;
  
  s_local = s;
  if ((0 < *length) &&
     ((UVar1 = isWhiteSpace((uint)(ushort)*s), UVar1 != '\0' ||
      (UVar1 = isWhiteSpace((uint)(ushort)s[*length + -1]), UVar1 != '\0')))) {
    local_24 = 0;
    local_28 = *length;
    while( true ) {
      bVar2 = false;
      if (local_24 < local_28) {
        UVar1 = isWhiteSpace((uint)(ushort)s[local_24]);
        bVar2 = UVar1 != '\0';
      }
      if (!bVar2) break;
      local_24 = local_24 + 1;
    }
    if (local_24 < local_28) {
      while (UVar1 = isWhiteSpace((uint)(ushort)s[local_28 + -1]), UVar1 != '\0') {
        local_28 = local_28 + -1;
      }
    }
    *length = local_28 - local_24;
    s_local = s + local_24;
  }
  return s_local;
}

Assistant:

const UChar *
PatternProps::trimWhiteSpace(const UChar *s, int32_t &length) {
    if(length<=0 || (!isWhiteSpace(s[0]) && !isWhiteSpace(s[length-1]))) {
        return s;
    }
    int32_t start=0;
    int32_t limit=length;
    while(start<limit && isWhiteSpace(s[start])) {
        ++start;
    }
    if(start<limit) {
        // There is non-white space at start; we will not move limit below that,
        // so we need not test start<limit in the loop.
        while(isWhiteSpace(s[limit-1])) {
            --limit;
        }
    }
    length=limit-start;
    return s+start;
}